

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AeronArchive.cpp
# Opt level: O3

int32_t __thiscall
aeron::archive::AeronArchive::listRecording
          (AeronArchive *this,int64_t recordingId,RecordingDescriptorConsumer *consumer)

{
  int64_t iVar1;
  _Any_data local_30;
  code *local_20;
  code *local_18;
  int64_t local_10;
  
  local_30._8_8_ = &local_10;
  local_18 = std::
             _Function_handler<bool_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/AeronArchive.cpp:268:9)>
             ::_M_invoke;
  local_20 = std::
             _Function_handler<bool_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/AeronArchive.cpp:268:9)>
             ::_M_manager;
  local_30._M_unused._M_object = this;
  local_10 = recordingId;
  iVar1 = callAndPollForDescriptors
                    (this,(function<bool_(long)> *)&local_30,1,consumer,"list recording");
  if (local_20 != (code *)0x0) {
    (*local_20)(&local_30,&local_30,__destroy_functor);
  }
  return (int32_t)iVar1;
}

Assistant:

std::int32_t AeronArchive::listRecording(std::int64_t recordingId, RecordingDescriptorConsumer&& consumer) {
    return callAndPollForDescriptors(
        [&](std::int64_t correlationId) {
            return this->archiveProxy_->listRecording(recordingId, correlationId, controlSessionId_);
        },
        1, std::move(consumer), "list recording");
}